

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)()>
          (torrent_handle *this,offset_in_torrent_to_subr f)

{
  bool bVar1;
  element_type *this_00;
  io_context *ctx;
  type_conflict5 local_88;
  session_impl *local_60;
  session_impl *ses;
  error_code_enum local_44;
  undefined1 local_40 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  offset_in_torrent_to_subr f_local;
  torrent_handle *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)f;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_40);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (!bVar1) {
    local_44 = invalid_torrent_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_44);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
  local_60 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ctx = libtorrent::aux::session_impl::get_context(local_60);
  local_88.ses = local_60;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            (&local_88.t,(shared_ptr<libtorrent::aux::torrent> *)local_40);
  local_88.f = (offset_in_torrent_to_subr)
               t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)()>(void(libtorrent::aux::torrent::*)())const::_lambda()_1_>
            (ctx,&local_88,(type *)0x0);
  const::{lambda()#1}::~async_call((_lambda___1_ *)&local_88);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_40);
  return;
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}